

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

TPZVec<TPZGeoNodeBC_*> * __thiscall
TPZVec<TPZGeoNodeBC_*>::operator=
          (TPZVec<TPZGeoNodeBC_*> *this,initializer_list<TPZGeoNodeBC_*> *list)

{
  size_type sVar1;
  const_iterator ppTVar2;
  initializer_list<TPZGeoNodeBC_*> *in_RSI;
  TPZVec<TPZGeoNodeBC_*> *in_RDI;
  TPZGeoNodeBC **aux;
  const_iterator it_end;
  const_iterator it;
  TPZGeoNodeBC **local_28;
  const_iterator local_18;
  
  sVar1 = std::initializer_list<TPZGeoNodeBC_*>::size(in_RSI);
  (*in_RDI->_vptr_TPZVec[3])(in_RDI,sVar1);
  local_18 = std::initializer_list<TPZGeoNodeBC_*>::begin(in_RSI);
  ppTVar2 = std::initializer_list<TPZGeoNodeBC_*>::end((initializer_list<TPZGeoNodeBC_*> *)in_RDI);
  local_28 = in_RDI->fStore;
  for (; local_18 != ppTVar2; local_18 = local_18 + 1) {
    *local_28 = *local_18;
    local_28 = local_28 + 1;
  }
  return in_RDI;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(const std::initializer_list<T> &list) {
	Resize(list.size());

	auto it = list.begin();
	auto it_end = list.end();
	auto *aux = fStore;

	for (; it != it_end; it++, aux++)
		*aux = *it;
	return *this;
}